

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_character.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>&,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               character_t<char> *fmt,unsigned_integer_t<unsigned_char,_2U,_2U> *others,
               character_t<char> *others_1,unsigned_integer_t<unsigned_char,_2U,_2U> *others_2,
               character_t<char> *others_3,unsigned_integer_t<unsigned_char,_2U,_2U> *others_4,
               optional_t<date::character_t<char>,_date::fraction_t<unsigned_int,_9U>_> *others_5,
               cases_t<date::branch_t<date::character_t<char>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::character_t<char>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_6)

{
  bool bVar1;
  value_type vVar2;
  char_type ch;
  unsigned_integer_t<unsigned_char,_2U,_2U> *others_local_2;
  character_t<char> *others_local_1;
  unsigned_integer_t<unsigned_char,_2U,_2U> *others_local;
  character_t<char> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator==
                    (pos,end);
  if (bVar1) {
    pos_local._7_1_ = false;
  }
  else {
    vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator*(pos)
    ;
    if (vVar2 == fmt->value) {
      iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
      pos_local._7_1_ =
           read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,unsigned_char,2u,2u,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::fraction_t<unsigned_int,9u>>&,date::cases_t<date::branch_t<date::character_t<char>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::character_t<char>,date::unsigned_integer_t<short,2u,2u>>>&>
                     (pos,end,others,others_1,others_2,others_3,others_4,others_5,others_6);
    }
    else {
      pos_local._7_1_ = false;
    }
  }
  return pos_local._7_1_;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, const character_t<Char>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    if (pos == end)
        return false;

    const char_type ch = *pos;
    if (ch != fmt.value)
        return false;

    ++pos;
    return read_impl(pos, end, std::forward<Others>(others)...);
}